

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O2

void __thiscall QBspTree::create(QBspTree *this,int n,int d)

{
  ulong uVar1;
  uint uVar2;
  
  if (d == -1) {
    d = 0;
    for (uVar1 = (ulong)(uint)n; (int)uVar1 != 0; uVar1 = (long)(int)uVar1 / 10) {
      d = d + 2;
    }
  }
  uVar2 = d + (uint)(d == 0);
  this->depth = uVar2;
  QList<QBspTree::Node>::resize(&this->nodes,~(-1L << ((byte)uVar2 & 0x3f)));
  QList<QList<int>_>::resize(&this->leaves,1L << ((byte)this->depth & 0x3f));
  return;
}

Assistant:

void QBspTree::create(int n, int d)
{
    // simple heuristics to find the best tree depth
    if (d == -1) {
        int c;
        for (c = 0; n; ++c)
            n = n / 10;
        depth = c << 1;
    } else {
        depth = d;
    }
    depth = qMax(depth, uint(1));

    nodes.resize((1ll << depth) - 1); // resize to number of nodes
    leaves.resize(1ll << depth); // resize to number of leaves
}